

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handle.cpp
# Opt level: O2

Handle remote::OpenProcess(string *name)

{
  bool bVar1;
  int iVar2;
  Handle HVar3;
  DIR *__dirp;
  dirent *pdVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  char *__s;
  bool bVar8;
  pid_t pid;
  Handle hProcess;
  string path;
  string local_11e0 [32];
  stringstream ss;
  long local_11b0 [3];
  uint auStack_1198 [88];
  char maps [4096];
  
  __dirp = opendir("/proc/");
  HVar3.pid = -1;
  if (__dirp != (DIR *)0x0) {
    do {
      while( true ) {
        do {
          do {
            do {
              pdVar4 = readdir(__dirp);
              if (pdVar4 == (dirent *)0x0) {
                return (Handle)-1;
              }
            } while (pdVar4->d_type != '\x04');
            __s = pdVar4->d_name;
            sVar5 = strspn(__s,"0123456789");
            sVar6 = strlen(__s);
          } while (sVar5 != sVar6);
          strncpy(maps,"/proc/",0x1000);
          strncat(maps,__s,0x1000);
          sVar5 = strlen(maps);
          builtin_strncpy(maps + sVar5,"/maps",6);
          iVar2 = access(maps,0);
        } while (iVar2 == -1);
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        *(uint *)((long)auStack_1198 + *(long *)(local_11b0[0] + -0x18)) =
             *(uint *)((long)auStack_1198 + *(long *)(local_11b0[0] + -0x18)) & 0xffffffb5 | 2;
        std::operator<<((ostream *)local_11b0,__s);
        std::istream::operator>>((istream *)&ss,&pid);
        HVar3 = OpenProcess(pid);
        hProcess = HVar3;
        if (HVar3.pid != -1) break;
LAB_001052e9:
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      }
      Handle::GetPath_abi_cxx11_(&path,&hProcess);
      lVar7 = std::__cxx11::string::rfind('\0',0x2f);
      if (lVar7 == -1) {
        bVar1 = false;
        bVar8 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)local_11e0,(ulong)&path);
        iVar2 = std::__cxx11::string::compare(local_11e0);
        bVar8 = iVar2 == 0;
        bVar1 = !bVar8;
        std::__cxx11::string::~string(local_11e0);
      }
      std::__cxx11::string::~string((string *)&path);
      if (bVar1) goto LAB_001052e9;
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    } while (!bVar8);
  }
  return (Handle)HVar3.pid;
}

Assistant:

Handle remote::OpenProcess(string name) {
    DIR* dir = opendir("/proc/");

    if(dir) {
        dirent* dire = NULL;

        while((dire = readdir(dir)) != NULL) {
            if(dire->d_type != DT_DIR)
                continue;

            // Check numeric
            if(strspn(dire->d_name, "0123456789") != strlen(dire->d_name))
                continue;

            char maps[PATH_MAX];
            strncpy(maps, "/proc/", PATH_MAX);
            strncat(maps, dire->d_name, PATH_MAX);
            strncat(maps, "/maps", PATH_MAX);

            if (access(maps, F_OK) == -1)
                continue;

            pid_t pid;

            stringstream ss;
            ss << dec << dire->d_name;
            ss >> pid;

            Handle hProcess = OpenProcess(pid);

            if(hProcess != INVALID_HANDLE_VALUE) {
                string path = hProcess.GetPath();

                size_t lastSlash = path.find_last_of('/');

                if(lastSlash == -1)
                    continue;

                if(path.substr(lastSlash, path.size()).compare(name) == 0)
                    return hProcess;
            }
        }
    }

    return INVALID_HANDLE_VALUE;
}